

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_prime.c
# Opt level: O1

int main(void)

{
  int iVar1;
  
  iVar1 = is_prime(0);
  if ((((((iVar1 != 1) && (iVar1 = is_prime(1), iVar1 != 1)) && (iVar1 = is_prime(2), iVar1 != 0))
       && ((iVar1 = is_prime(3), iVar1 != 0 && (iVar1 = is_prime(4), iVar1 != 1)))) &&
      ((iVar1 = is_prime(0x9527), iVar1 != 0 &&
       ((iVar1 = is_prime(0x49923f55), iVar1 != 0 && (iVar1 = is_prime(0x4629bce9480b3), iVar1 != 1)
        ))))) &&
     ((iVar1 = is_prime(0x4629bce9480f3), iVar1 != 0 &&
      (iVar1 = is_prime(0x112130abe7f61769), iVar1 != 0)))) {
    return 0;
  }
  return 1;
}

Assistant:

int main() {

    if(is_prime(0) == 1)
        goto error;

    if(is_prime(1) == 1)
        goto error;

    if(is_prime(2) == 0)
        goto error;

    if(is_prime(3) == 0)
        goto error;

    if(is_prime(4) == 1)
        goto error;

    if(is_prime(38183) == 0)
        goto error;

    if(is_prime(1234321237) == 0)
        goto error;

    if(is_prime(1234321232134323) == 1)
        goto error;

    if(is_prime(1234321232134387) == 0)
        goto error;

    if(is_prime(1234321287765432169) == 0)
        goto error;

    return 0;


    error:
        return 1;

}